

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiOldColumns *pIVar1;
  int i;
  ImVector<ImGuiOldColumns> *this;
  ImGuiOldColumns IStack_a8;
  
  this = &window->ColumnsStorage;
  i = 0;
  while( true ) {
    if (this->Size <= i) {
      memset(&IStack_a8,0,0x88);
      ImVector<ImGuiOldColumns>::push_back(this,&IStack_a8);
      ImGuiOldColumns::~ImGuiOldColumns(&IStack_a8);
      pIVar1 = ImVector<ImGuiOldColumns>::back(this);
      pIVar1->ID = id;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiOldColumns>::operator[](this,i);
    if (pIVar1->ID == id) break;
    i = i + 1;
  }
  pIVar1 = ImVector<ImGuiOldColumns>::operator[](this,i);
  return pIVar1;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}